

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O2

void anon_unknown.dwarf_9286c::testHalfToUint(uint halfVal,uint uintVal)

{
  half hVar1;
  uint uVar2;
  ostream *poVar3;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"halfToUint (");
  hVar1._h = (uint16_t)halfVal;
  poVar3 = (ostream *)::operator<<(poVar3,hVar1);
  poVar3 = std::operator<<(poVar3,") == ");
  Imf_3_2::halfToUint(hVar1);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar2 = Imf_3_2::halfToUint(hVar1);
  if (uVar2 == uintVal) {
    return;
  }
  __assert_fail("halfToUint (h) == uintVal",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                ,0x38,"void (anonymous namespace)::testHalfToUint(unsigned int, unsigned int)");
}

Assistant:

void
testHalfToUint (unsigned int halfVal, unsigned int uintVal)
{
    half h;
    h.setBits (halfVal);
    cout << "halfToUint (" << h << ") == " << halfToUint (h) << endl;
    assert (halfToUint (h) == uintVal);
}